

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisNodeHandlerModrmMod
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  byte bVar1;
  ZyanU8 data;
  ZyanUSize ZVar2;
  ZyanU8 *pZVar3;
  
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf0e,
                  "ZyanStatus ZydisNodeHandlerModrmMod(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if ((instruction->raw).modrm.offset == '\0') {
    bVar1 = instruction->length;
    (instruction->raw).modrm.offset = bVar1;
    if (0xe < bVar1) {
      return 0x80200002;
    }
    ZVar2 = state->buffer_len;
    if (ZVar2 == 0) {
      return 0x80200000;
    }
    pZVar3 = state->buffer;
    state->buffer = pZVar3 + 1;
    data = *pZVar3;
    instruction->length = bVar1 + 1;
    state->buffer_len = ZVar2 - 1;
    ZydisDecodeModRM(instruction,data);
  }
  *index = (ushort)(instruction->raw).modrm.mod;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisNodeHandlerModrmMod(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    if (!instruction->raw.modrm.offset)
    {
        instruction->raw.modrm.offset = instruction->length;
        ZyanU8 modrm_byte;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &modrm_byte));
        ZydisDecodeModRM(instruction, modrm_byte);
    }
    *index = instruction->raw.modrm.mod;
    return ZYAN_STATUS_SUCCESS;
}